

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute *a,xml_node *parent,
          xpath_allocator *alloc)

{
  char cVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  xml_node_struct *string;
  xpath_node local_40;
  
  pxVar2 = (xml_node_struct *)a->_attr;
  if (pxVar2 != (xml_node_struct *)0x0) {
    string = (xml_node_struct *)0x124407;
    if (pxVar2->parent != (xml_node_struct *)0x0) {
      string = pxVar2->parent;
    }
    bVar3 = starts_with((char_t *)string,"xmlns");
    if ((!bVar3) ||
       ((cVar1 = *(char *)((long)&string->header + 5), cVar1 != '\0' && (cVar1 != ':')))) {
      switch(this->_test) {
      case '\x01':
        bVar3 = strequal((char_t *)string,(this->_data).string);
        if (!bVar3) {
          return;
        }
        local_40._attribute = (xml_attribute)a->_attr;
        local_40._node._root = (xml_node_struct *)local_40._attribute._attr;
        if ((xml_node_struct *)local_40._attribute._attr != (xml_node_struct *)0x0) {
          local_40._node = (xml_node)parent->_root;
        }
        break;
      default:
        goto switchD_0012206a_caseD_3;
      case '\b':
        bVar3 = starts_with((char_t *)string,(this->_data).string);
        if (!bVar3) {
          return;
        }
      case '\x02':
      case '\a':
        local_40._node._root = parent->_root;
        local_40._attribute._attr = (xml_attribute_struct *)pxVar2;
      }
      xpath_node_set_raw::push_back(ns,&local_40,alloc);
    }
  }
switchD_0012206a_caseD_3:
  return;
}

Assistant:

void step_push(xpath_node_set_raw& ns, const xml_attribute& a, const xml_node& parent, xpath_allocator* alloc)
		{
			if (!a) return;

			const char_t* name = a.name();

			// There are no attribute nodes corresponding to attributes that declare namespaces
			// That is, "xmlns:..." or "xmlns"
			if (starts_with(name, PUGIXML_TEXT("xmlns")) && (name[5] == 0 || name[5] == ':')) return;
			
			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest)) ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_type_node:
			case nodetest_all:
				ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest))
					ns.push_back(xpath_node(a, parent), alloc);
				break;
			
			default:
				;
			}
		}